

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

size_t sorter_merge_sort_in_place_backmerge(int64_t *dst1,size_t l1,int64_t *dst2,size_t l2)

{
  long lVar1;
  int64_t iVar2;
  int64_t _sort_swap_temp_1;
  long lVar3;
  size_t sVar4;
  int64_t _sort_swap_temp;
  int64_t *piVar5;
  int64_t *piVar6;
  int64_t *piVar7;
  long lVar8;
  
  _sort_swap_temp_1 = l1;
  if (*dst2 <= dst1[1 - l1]) {
    sVar4 = 0;
    do {
      iVar2 = dst1[(sVar4 + 1) - l1];
      dst1[(sVar4 + 1) - l1] = dst2[sVar4 + 1];
      dst2[sVar4 + 1] = iVar2;
      sVar4 = sVar4 + 1;
    } while (l1 != sVar4);
    return _sort_swap_temp_1;
  }
  piVar7 = dst2 + l1;
  do {
    sVar4 = l1;
    lVar8 = 0;
    piVar5 = dst1;
    piVar6 = piVar7;
    while( true ) {
      piVar6 = piVar6 + -1;
      lVar3 = *dst2;
      lVar1 = dst1[lVar8];
      if (lVar1 <= lVar3) break;
      dst1[lVar8] = piVar7[lVar8];
      piVar7[lVar8] = lVar1;
      piVar5 = piVar5 + -1;
      lVar8 = lVar8 + -1;
      if (sVar4 + lVar8 == 0) {
        return 0;
      }
    }
    *dst2 = piVar7[lVar8];
    piVar7[lVar8] = lVar3;
    dst2 = dst2 + -1;
    l2 = l2 - 1;
    l1 = sVar4 + lVar8;
    dst1 = piVar5;
    piVar7 = piVar6;
    if (l2 == 0) {
      lVar3 = 0;
      do {
        iVar2 = piVar5[lVar3];
        piVar5[lVar3] = piVar6[lVar3];
        piVar6[lVar3] = iVar2;
        lVar1 = sVar4 + lVar8 + lVar3;
        lVar3 = lVar3 + -1;
      } while (lVar1 != 1);
      return sVar4 + lVar8;
    }
  } while( true );
}

Assistant:

size_t MERGE_SORT_IN_PLACE_BACKMERGE(SORT_TYPE *dst1, size_t l1,
                                     SORT_TYPE *dst2, size_t l2) {
  size_t res;
  SORT_TYPE *dst0 = dst2 + l1;

  if (SORT_CMP(dst1[1 - l1], dst2[0]) >= 0) {
    MERGE_SORT_IN_PLACE_ASWAP(dst1 - l1 + 1, dst0 - l1 + 1, l1);
    return l1;
  }

  do {
    while (SORT_CMP(*dst2, *dst1) < 0) {
      SORT_SWAP(*dst1, *dst0);
      dst1--;
      dst0--;

      if (--l1 == 0) {
        return 0;
      }
    }

    SORT_SWAP(*dst2, *dst0);
    dst2--;
    dst0--;
  } while (--l2);

  res = l1;

  do {
    SORT_SWAP(*dst1, *dst0);
    dst1--;
    dst0--;
  } while (--l1);

  return res;
}